

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Reference __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::
ReadReference(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
              *this)

{
  char cVar1;
  Reference RVar2;
  undefined8 *in_RDI;
  BinaryReaderBase *in_stack_00000008;
  CStringRef in_stack_00000010;
  BasicCStringRef<char> in_stack_fffffffffffffff0;
  
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
  if (cVar1 != 'v') {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xfffffffffffffff0,"expected reference");
    BinaryReaderBase::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  RVar2 = DoReadReference((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
                           *)in_stack_fffffffffffffff0.data_);
  return RVar2;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }